

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O3

void * __thiscall
ft::
vector<ft::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_ft::allocator<ft::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
::realloc(vector<ft::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_ft::allocator<ft::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *this,void *__ptr,size_t __size)

{
  pointer ppVar1;
  long lVar2;
  long *plVar3;
  pointer ppVar4;
  long *plVar5;
  void *pvVar6;
  long lVar7;
  ulong uVar8;
  
  pvVar6 = (void *)((long)__ptr + (ulong)(__ptr == (void *)0x0));
  ppVar4 = (pointer)operator_new((long)pvVar6 * 0x28);
  if (this->m_size != 0) {
    lVar7 = 0x10;
    uVar8 = 0;
    do {
      ppVar1 = this->m_data;
      *(long *)((long)ppVar4 + lVar7 + -0x10) = (long)&(ppVar4->first)._M_dataplus._M_p + lVar7;
      lVar2 = *(long *)((long)ppVar1 + lVar7 + -0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)((long)ppVar4 + lVar7 + -0x10),lVar2,
                 *(long *)((long)ppVar1 + lVar7 + -8) + lVar2);
      *(undefined4 *)((long)&(ppVar4->first).field_2 + lVar7) =
           *(undefined4 *)((long)&(ppVar1->first).field_2 + lVar7);
      plVar3 = *(long **)((long)this->m_data + lVar7 + -0x10);
      plVar5 = (long *)((long)&(this->m_data->first)._M_dataplus._M_p + lVar7);
      if (plVar5 != plVar3) {
        operator_delete(plVar3,*plVar5 + 1);
      }
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x28;
    } while (uVar8 < this->m_size);
  }
  operator_delete(this->m_data);
  this->m_data = ppVar4;
  this->m_capacity = (size_type)pvVar6;
  return pvVar6;
}

Assistant:

void	realloc(size_type newCapacity) {
		if (newCapacity == 0)
			newCapacity = 1;
		pointer	newBlock = this->get_allocator().allocate(newCapacity);
		for (size_type i = 0; i < this->size(); ++i)
		{
			this->get_allocator().construct(newBlock + i, this->m_data[i]);
			this->get_allocator().destroy(this->m_data + i);
		}
		this->get_allocator().deallocate(this->m_data, this->capacity());
		this->m_data = newBlock;
		this->m_capacity = newCapacity;
	}